

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

msgpack_unpack_return
msgpack_unpack(char *data,size_t len,size_t *off,msgpack_zone *result_zone,msgpack_object *result)

{
  msgpack_unpack_return mVar1;
  size_t noff;
  template_context ctx;
  size_t local_840;
  template_context local_838;
  
  local_840 = 0;
  if (off != (size_t *)0x0) {
    local_840 = *off;
  }
  mVar1 = MSGPACK_UNPACK_CONTINUE;
  if (local_840 < len) {
    local_838.cs = 0;
    local_838.trail = 0;
    local_838.top = 0;
    local_838.stack[0].obj.type = MSGPACK_OBJECT_NIL;
    local_838.user.referenced = false;
    local_838.user.z = result_zone;
    mVar1 = template_execute(&local_838,data,len,&local_840);
    if (MSGPACK_UNPACK_PARSE_ERROR < mVar1) {
      if (off != (size_t *)0x0) {
        *off = local_840;
      }
      if (mVar1 == MSGPACK_UNPACK_CONTINUE) {
        mVar1 = MSGPACK_UNPACK_CONTINUE;
      }
      else {
        (result->via).array.ptr = local_838.stack[0].obj.via.array.ptr;
        *(ulong *)result = CONCAT44(local_838.stack[0].obj._4_4_,local_838.stack[0].obj.type);
        (result->via).u64 = local_838.stack[0].obj.via.u64;
        mVar1 = MSGPACK_UNPACK_SUCCESS - (uint)(local_840 < len);
      }
    }
  }
  return mVar1;
}

Assistant:

msgpack_unpack_return
msgpack_unpack(const char* data, size_t len, size_t* off,
        msgpack_zone* result_zone, msgpack_object* result)
{
    size_t noff = 0;
    if(off != NULL) { noff = *off; }

    if(len <= noff) {
        // FIXME
        return MSGPACK_UNPACK_CONTINUE;
    }
    else {
        int e;
        template_context ctx;
        template_init(&ctx);

        ctx.user.z = result_zone;
        ctx.user.referenced = false;

        e = template_execute(&ctx, data, len, &noff);
        if(e < 0) {
            return e;
        }

        if(off != NULL) { *off = noff; }

        if(e == 0) {
            return MSGPACK_UNPACK_CONTINUE;
        }

        *result = template_data(&ctx);

        if(noff < len) {
            return MSGPACK_UNPACK_EXTRA_BYTES;
        }

        return MSGPACK_UNPACK_SUCCESS;
    }
}